

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O3

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetUser(TgTypeParser *this,ptree *data)

{
  type_conflict4 *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  optional<bool> oVar3;
  type_conflict4 tVar4;
  undefined8 *puVar5;
  self_type *psVar6;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  Ptr PVar8;
  path_type local_90;
  type local_60;
  locale local_40 [8];
  element_type *local_38;
  
  puVar5 = (undefined8 *)operator_new(0x98);
  puVar5[1] = 0x100000001;
  *puVar5 = &PTR___Sp_counted_ptr_inplace_002a5180;
  __s = (type_conflict4 *)(puVar5 + 2);
  memset(__s,0,0x88);
  puVar5[3] = puVar5 + 5;
  puVar5[7] = puVar5 + 9;
  puVar5[0xb] = puVar5 + 0xd;
  puVar5[0xf] = puVar5 + 0x11;
  *(undefined8 **)(this + 8) = puVar5;
  *(type_conflict4 **)this = __s;
  local_90.m_value._M_dataplus._M_p = (pointer)&local_90.m_value.field_2;
  local_38 = (element_type *)this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"id","");
  local_90.m_separator = '.';
  local_90.m_start._M_current = local_90.m_value._M_dataplus._M_p;
  psVar6 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_90);
  std::locale::locale(local_40);
  std::locale::locale((locale *)&local_60,local_40);
  tVar4 = boost::property_tree::
          basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
          get_value<int,boost::property_tree::stream_translator<char,std::char_traits<char>,std::allocator<char>,int>>
                    ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)psVar6,
                     (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> *)
                     &local_60);
  std::locale::~locale((locale *)&local_60);
  std::locale::~locale(local_40);
  *__s = tVar4;
  paVar1 = &local_90.m_value.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_value._M_dataplus._M_p);
  }
  local_90.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"is_bot","");
  local_90.m_separator = '.';
  local_90.m_start._M_current = local_90.m_value._M_dataplus._M_p;
  oVar3 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<bool>(in_RDX,&local_90);
  *(byte *)((long)puVar5 + 0x14) = oVar3.super_type.m_storage & oVar3.super_type.m_initialized & 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_value._M_dataplus._M_p);
  }
  local_90.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"first_name","");
  local_90.m_separator = '.';
  local_90.m_start._M_current = local_90.m_value._M_dataplus._M_p;
  psVar6 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_90);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (&local_60,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)psVar6);
  std::__cxx11::string::operator=((string *)(puVar5 + 3),(string *)&local_60);
  paVar2 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_value._M_dataplus._M_p);
  }
  local_90.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"last_name","");
  local_90.m_separator = '.';
  local_90.m_start._M_current = local_90.m_value._M_dataplus._M_p;
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_60,in_RDX,&local_90,"");
  std::__cxx11::string::operator=((string *)(puVar5 + 7),(string *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_value._M_dataplus._M_p);
  }
  local_90.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"username","");
  local_90.m_separator = '.';
  local_90.m_start._M_current = local_90.m_value._M_dataplus._M_p;
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_60,in_RDX,&local_90,"");
  std::__cxx11::string::operator=((string *)(puVar5 + 0xb),(string *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_value._M_dataplus._M_p);
  }
  local_90.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"language_code","");
  local_90.m_separator = '.';
  local_90.m_start._M_current = local_90.m_value._M_dataplus._M_p;
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_60,in_RDX,&local_90,"");
  std::__cxx11::string::operator=((string *)(puVar5 + 0xf),(string *)&local_60);
  _Var7._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p);
    _Var7._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_value._M_dataplus._M_p);
    _Var7._M_pi = extraout_RDX_01;
  }
  PVar8.super___shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var7._M_pi;
  PVar8.super___shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_38;
  return (Ptr)PVar8.super___shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

User::Ptr TgTypeParser::parseJsonAndGetUser(const ptree& data) const {
    auto result(make_shared<User>());
    result->id = data.get<int32_t>("id");
    result->isBot = data.get<bool>("is_bot", false);
    result->firstName = data.get<string>("first_name");
    result->lastName = data.get("last_name", "");
    result->username = data.get("username", "");
    result->languageCode = data.get("language_code", "");
    return result;
}